

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<4,_9,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  float *pfVar2;
  Vector<float,_3> *pVVar3;
  long lVar4;
  undefined4 *puVar5;
  Vector<float,_3> *b;
  long lVar6;
  Vector<float,_3> *pVVar7;
  undefined8 *puVar8;
  int col;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar13;
  undefined4 uVar14;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Mat3 m_1;
  Mat3 m;
  float afStack_b8 [6];
  float local_a0 [2];
  undefined8 local_98;
  undefined4 local_90;
  Matrix<float,_3,_3> local_88;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  Matrix<float,_3,_3> local_2c;
  long lVar12;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_58;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar9 = 0;
      auVar10 = _DAT_00ada920;
      do {
        bVar13 = SUB164(auVar10 ^ _DAT_00ad8f80,4) == -0x80000000 &&
                 SUB164(auVar10 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
        if (bVar13) {
          uVar14 = 0x3f800000;
          if (lVar4 != lVar9) {
            uVar14 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar9) = uVar14;
        }
        if (bVar13) {
          uVar14 = 0x3f800000;
          if (lVar4 + -0xc != lVar9) {
            uVar14 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar9 + 0xc) = uVar14;
        }
        lVar12 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar12 + 2;
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x30);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0xc;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar6 != 3);
    local_58 = *(undefined8 *)evalCtx->in[0].m_data;
    local_48 = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    uStack_50 = CONCAT44(evalCtx->in[1].m_data[0],evalCtx->in[0].m_data[2]);
    local_38 = evalCtx->in[2].m_data[2];
    uStack_40 = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    puVar1 = &local_58;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_38 = 0.0;
    puVar5 = &s_constInMat3x3;
    lVar4 = 0;
    do {
      lVar6 = 0;
      puVar8 = puVar1;
      do {
        *(undefined4 *)puVar8 = puVar5[lVar6];
        lVar6 = lVar6 + 1;
        puVar8 = (undefined8 *)((long)puVar8 + 0xc);
      } while (lVar6 != 3);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar5 = puVar5 + 3;
    } while (lVar4 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar2 = (float *)&local_88;
    b = (Vector<float,_3> *)0x0;
    lVar4 = 0;
    do {
      pVVar3 = (Vector<float,_3> *)0x0;
      auVar11 = _DAT_00ada920;
      do {
        bVar13 = SUB164(auVar11 ^ _DAT_00ad8f80,4) == -0x80000000 &&
                 SUB164(auVar11 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
        if (bVar13) {
          uVar14 = 0x3f800000;
          if (b != pVVar3) {
            uVar14 = 0;
          }
          *(undefined4 *)((long)pfVar2 + (long)pVVar3) = uVar14;
        }
        if (bVar13) {
          uVar14 = 0x3f800000;
          if ((((Matrix<float,_3,_3> *)((long)b + -0x24))->m_data).m_data + 2 != pVVar3) {
            uVar14 = 0;
          }
          *(undefined4 *)((long)pVVar3[1].m_data + (long)pfVar2) = uVar14;
        }
        lVar6 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar6 + 2;
        pVVar3 = pVVar3 + 2;
      } while (pVVar3 != (Vector<float,_3> *)0x30);
      lVar4 = lVar4 + 1;
      b = (((Matrix<float,_3,_3> *)b)->m_data).m_data + 1;
      pfVar2 = pfVar2 + 1;
    } while (lVar4 != 3);
    local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_88.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_88.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_88.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_88.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
    local_88.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    pVVar3 = (Vector<float,_3> *)&local_88;
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[2] = 0.0;
    local_88.m_data.m_data[2].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[2] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[2] = 0.0;
    b = (Vector<float,_3> *)&DAT_00ae3d34;
    lVar4 = 0;
    do {
      lVar6 = 0;
      pVVar7 = pVVar3;
      do {
        ((Vector<tcu::Vector<float,_3>,_3> *)pVVar7->m_data)->m_data[0].m_data[0] = b->m_data[lVar6]
        ;
        lVar6 = lVar6 + 1;
        pVVar7 = pVVar7 + 1;
      } while (lVar6 != 3);
      lVar4 = lVar4 + 1;
      pVVar3 = (Vector<float,_3> *)(pVVar3->m_data + 1);
      b = b + 1;
    } while (lVar4 != 3);
  }
  matrixCompMult<float,3,3>
            (&local_2c,(MatrixCaseUtils *)&local_58,&local_88,(Matrix<float,_3,_3> *)b);
  local_98 = (ulong)local_98._4_4_ << 0x20;
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  lVar4 = 0;
  do {
    local_a0[lVar4] =
         local_2c.m_data.m_data[0].m_data[lVar4] + local_2c.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  afStack_b8[4] = 0.0;
  afStack_b8[2] = 0.0;
  afStack_b8[3] = 0.0;
  lVar4 = 0;
  do {
    afStack_b8[lVar4 + 2] = local_a0[lVar4] + local_2c.m_data.m_data[2].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_98 = 0x100000000;
  local_90 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_a0[lVar4]] = afStack_b8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}